

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

MemberSyntax * parseMember(string *text)

{
  MemberSyntax *pMVar1;
  SourceManager *sourceManager;
  string_view source;
  StringRef macroName;
  string_view name;
  StringRef capturedExpression;
  MemberSyntax *member;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_748;
  Parser parser;
  Preprocessor preprocessor;
  
  slang::SmallVectorBase<slang::Diagnostic>::clear
            ((SmallVectorBase<slang::Diagnostic> *)&slang::diagnostics);
  sourceManager = getSourceManager();
  parser.super_ParserBase.window.currentToken.info = (Info *)0x0;
  parser.super_ParserBase.window.lastConsumed.kind = Unknown;
  parser.super_ParserBase.window.lastConsumed._2_1_ = 0;
  parser.super_ParserBase.window.lastConsumed.numFlags.raw = '\0';
  parser.super_ParserBase.window.lastConsumed.rawLen = 0;
  parser.super_ParserBase.window.buffer = (Token *)0x0;
  parser.super_ParserBase.window.currentToken.kind = Unknown;
  parser.super_ParserBase.window.currentToken._2_1_ = 0;
  parser.super_ParserBase.window.currentToken.numFlags.raw = '\0';
  parser.super_ParserBase.window.currentToken.rawLen = 0;
  parser.super_ParserBase.alloc = (BumpAllocator *)0x0;
  parser.super_ParserBase.window.tokenSource = (Preprocessor *)0x0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&parser);
  slang::parsing::Preprocessor::Preprocessor
            (&preprocessor,sourceManager,(BumpAllocator *)slang::alloc,
             (Diagnostics *)&slang::diagnostics,(Bag *)&parser,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&parser);
  source._M_str = (text->_M_dataplus)._M_p;
  source._M_len = text->_M_string_length;
  name._M_str = "source";
  name._M_len = 6;
  slang::parsing::Preprocessor::pushSource(&preprocessor,source,name);
  catchAssertionHandler.m_assertionInfo.capturedExpression.m_start = (char *)0x0;
  catchAssertionHandler.m_assertionInfo.capturedExpression.m_size = 0;
  catchAssertionHandler.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler.m_assertionInfo.lineInfo.line = 0;
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  catchAssertionHandler.m_assertionInfo.macroName.m_size = 0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&catchAssertionHandler);
  slang::parsing::Parser::Parser(&parser,&preprocessor,(Bag *)&catchAssertionHandler);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&catchAssertionHandler);
  member = slang::parsing::Parser::parseSingleMember(&parser,ModuleDeclaration);
  local_748.file =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_748.line = 0x85;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 6;
  capturedExpression.m_start = "member";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,&local_748,capturedExpression,Normal);
  local_748.file = (char *)&member;
  Catch::AssertionHandler::handleExpr<slang::syntax::MemberSyntax*&>
            (&catchAssertionHandler,(ExprLhs<slang::syntax::MemberSyntax_*&> *)&local_748);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  pMVar1 = member;
  slang::parsing::Parser::~Parser(&parser);
  slang::parsing::Preprocessor::~Preprocessor(&preprocessor);
  return pMVar1;
}

Assistant:

const MemberSyntax& parseMember(const std::string& text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Parser parser(preprocessor);
    MemberSyntax* member = parser.parseSingleMember(SyntaxKind::ModuleDeclaration);
    REQUIRE(member);
    return *member;
}